

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_msg_chop_u16(nng_msg *m,uint16_t *vp)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  
  sVar3 = nni_msg_len(m);
  iVar2 = 3;
  if (1 < sVar3) {
    pvVar4 = nni_msg_body(m);
    sVar3 = nni_msg_len(m);
    uVar1 = *(ushort *)((long)pvVar4 + (sVar3 - 2));
    nni_msg_chop(m,2);
    *vp = uVar1 << 8 | uVar1 >> 8;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nng_msg_chop_u16(nng_msg *m, uint16_t *vp)
{
	uint8_t *body;
	uint16_t v;
	if (nni_msg_len(m) < sizeof(*vp)) {
		return (NNG_EINVAL);
	}
	body = nni_msg_body(m);
	body += nni_msg_len(m);
	body -= sizeof(v);
	NNI_GET16(body, v);
	(void) nni_msg_chop(m, sizeof(v));
	*vp = v;
	return (0);
}